

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O1

void __thiscall
tl::Vector<glm::mat<4,_4,_float,_(glm::qualifier)0>_>::reserve
          (Vector<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *this,size_t capacity)

{
  mat<4,_4,_float,_(glm::qualifier)0> *__src;
  mat<4,_4,_float,_(glm::qualifier)0> *__dest;
  
  if (this->_capacity < capacity) {
    __dest = (mat<4,_4,_float,_(glm::qualifier)0> *)operator_new__(capacity << 6);
    __src = this->_data;
    if (__src != (mat<4,_4,_float,_(glm::qualifier)0> *)0x0) {
      memcpy(__dest,__src,this->_size << 6);
      operator_delete__(__src);
    }
    this->_data = __dest;
    this->_capacity = capacity;
  }
  return;
}

Assistant:

void Vector<T>::reserve(size_t capacity)noexcept
{
    if(capacity > _capacity) {
        T* data = reinterpret_cast<T*>(new char[sizeof(T) * capacity]);
        if(_data) {
            memcpy(data, _data, _size * sizeof(T));
            delete[] (char*)_data;
        }
        _data = data;
        _capacity = capacity;
    }
}